

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

double waitforflags(int *ptr1,int *ptr2)

{
  int *in_RSI;
  int *in_RDI;
  bool bVar1;
  double val;
  int i;
  undefined8 local_20;
  undefined4 local_14;
  
  local_14 = 1;
  local_20 = 0.0;
  while( true ) {
    bVar1 = true;
    if (*in_RDI != 0) {
      bVar1 = *in_RSI == 0;
    }
    if (!bVar1) break;
    local_20 = exp(-(double)local_14);
    local_14 = local_14 + 1;
  }
  return local_20;
}

Assistant:

static inline double waitforflags (int *ptr1, int *ptr2)
{
  int i = 1;
  double val = 0;
  while (*ptr1 ==  0 || *ptr2 == 0) {
    val = exp(-(double)i++);
  }
#if 0
  printf("%d: flags set at %p and %p\n",GAme,ptr1,ptr2); fflush(stdout);
#endif
  return(val);
}